

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_normalize_C(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  undefined1 *puVar1;
  int iVar2;
  uint32_t uVar3;
  archive_string *paVar4;
  int iVar5;
  long in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  long *in_RDI;
  wchar_t _i_1;
  wchar_t j;
  wchar_t _i;
  wchar_t TIndex;
  wchar_t VIndex;
  uint32_t nfc;
  wchar_t SIndex;
  wchar_t LIndex;
  wchar_t ucx_size;
  wchar_t nx;
  wchar_t i;
  wchar_t cx;
  wchar_t cl;
  wchar_t ccx [10];
  uint32_t ucx [10];
  char *uc2ptr;
  char *ucptr;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  wchar_t tm;
  wchar_t ts;
  wchar_t spair;
  wchar_t ret;
  wchar_t n2;
  wchar_t n;
  wchar_t always_replace;
  size_t w;
  uint32_t uc2;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  size_t in_stack_fffffffffffffe90;
  archive_string *in_stack_fffffffffffffe98;
  uint local_15c;
  uint local_150;
  uint local_14c;
  uint local_13c;
  int local_11c;
  int local_118;
  int local_114;
  int local_fc;
  int local_f8;
  int local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8 [12];
  uint local_b8 [10];
  undefined1 *local_90;
  undefined1 *local_88;
  code *local_80;
  code *local_78;
  int local_6c;
  int local_68;
  int local_64;
  wchar_t local_60;
  int local_5c;
  int local_58;
  uint local_54;
  long local_50;
  uint local_48;
  uint32_t local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  long local_20;
  long *local_10;
  
  local_60 = L'\0';
  local_68 = 1;
  if ((*(uint *)(in_RCX + 0x24) & 0x400) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x1000) == 0) {
      if ((*(uint *)(in_RCX + 0x24) & 0x100) == 0) {
        local_54 = 0;
        if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
          if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
            local_80 = unicode_to_utf8;
          }
          else {
            local_80 = unicode_to_utf16le;
            local_68 = 2;
          }
        }
        else {
          local_80 = unicode_to_utf16be;
          local_68 = 2;
        }
      }
      else {
        local_80 = unicode_to_utf8;
        local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x200) == 0);
      }
    }
    else {
      local_80 = unicode_to_utf16le;
      local_68 = 2;
      local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x2000) == 0);
    }
  }
  else {
    local_80 = unicode_to_utf16be;
    local_68 = 2;
    local_54 = (uint)((*(uint *)(in_RCX + 0x24) & 0x800) == 0);
  }
  if ((*(uint *)(in_RCX + 0x24) & 0x800) == 0) {
    if ((*(uint *)(in_RCX + 0x24) & 0x2000) == 0) {
      local_78 = cesu8_to_unicode;
      local_6c = local_68;
      local_64 = 6;
    }
    else {
      local_78 = utf16le_to_unicode;
      local_6c = 1;
      local_64 = 4;
    }
  }
  else {
    local_78 = utf16be_to_unicode;
    local_6c = 1;
    local_64 = 4;
  }
  local_30 = in_RSI;
  local_20 = in_RDX;
  local_10 = in_RDI;
  paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (paVar4 == (archive_string *)0x0) {
    return L'\xffffffff';
  }
  local_38 = (undefined1 *)(*local_10 + local_10[1]);
  local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
LAB_00280eee:
  while (local_58 = (*local_78)(&local_44,local_30,local_20), local_58 != 0) {
    if (-1 < local_58) {
      if ((local_58 == local_64) || (local_54 != 0)) {
        local_88 = (undefined1 *)0x0;
      }
      else {
        local_88 = local_30;
      }
      local_30 = local_30 + local_58;
      local_20 = local_20 - local_58;
      while (local_5c = (*local_78)(&local_48,local_30,local_20), 0 < local_5c) {
        if ((local_5c == local_64) || (local_54 != 0)) {
          local_90 = (undefined1 *)0x0;
        }
        else {
          local_90 = local_30;
        }
        local_30 = local_30 + local_5c;
        local_20 = local_20 - local_5c;
        if ((local_48 >> 8 < 0x1d3) && (""[local_48 >> 8] != '\0')) {
          iVar5 = local_44 - 0x1100;
          if ((iVar5 < 0) || (0x12 < iVar5)) {
            iVar5 = local_44 - 0xac00;
            if ((iVar5 < 0) || ((0x2ba3 < iVar5 || (iVar5 % 0x1c != 0)))) {
              uVar3 = get_nfc(local_44,local_48);
              if (uVar3 == 0) {
                if (local_48 < 0x1d245) {
                  local_13c = (uint)ccc_val[ccc_val_index[""[local_48 >> 8]][local_48 >> 4 & 0xf]]
                                    [local_48 & 0xf];
                }
                else {
                  local_13c = 0;
                }
                local_ec = local_13c;
                if (local_13c != 0) {
                  local_f0 = 0;
                  local_b8[0] = local_48;
                  local_e8[0] = local_13c;
                  local_114 = 1;
                  goto LAB_002820f1;
                }
                if (local_88 == (undefined1 *)0x0) {
                  while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
                        local_50 == 0) {
                    local_10[1] = (long)local_38 - *local_10;
                    paVar4 = archive_string_ensure
                                       (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                    if (paVar4 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    local_38 = (undefined1 *)(*local_10 + local_10[1]);
                    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                  }
                  local_38 = local_38 + local_50;
                }
                else {
                  if (local_40 < local_38 + local_58) {
                    local_10[1] = (long)local_38 - *local_10;
                    paVar4 = archive_string_ensure
                                       (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                    if (paVar4 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    local_38 = (undefined1 *)(*local_10 + local_10[1]);
                    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                  }
                  switch(local_58) {
                  case 4:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 3:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 2:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 1:
                    *local_38 = *local_88;
                    local_38 = local_38 + 1;
                  }
                }
                local_44 = local_48;
                local_88 = local_90;
                local_58 = local_5c;
              }
              else {
                local_88 = (undefined1 *)0x0;
                local_44 = uVar3;
              }
            }
            else {
              iVar5 = local_48 - 0x11a7;
              if ((iVar5 < 1) || (0x1b < iVar5)) {
                if (local_88 == (undefined1 *)0x0) {
                  while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
                        local_50 == 0) {
                    local_10[1] = (long)local_38 - *local_10;
                    paVar4 = archive_string_ensure
                                       (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                    if (paVar4 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    local_38 = (undefined1 *)(*local_10 + local_10[1]);
                    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                  }
                  local_38 = local_38 + local_50;
                }
                else {
                  if (local_40 < local_38 + local_58) {
                    local_10[1] = (long)local_38 - *local_10;
                    paVar4 = archive_string_ensure
                                       (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                    if (paVar4 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    local_38 = (undefined1 *)(*local_10 + local_10[1]);
                    local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                  }
                  switch(local_58) {
                  case 4:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 3:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 2:
                    *local_38 = *local_88;
                    local_88 = local_88 + 1;
                    local_38 = local_38 + 1;
                  case 1:
                    *local_38 = *local_88;
                    local_38 = local_38 + 1;
                  }
                }
                local_44 = local_48;
                local_88 = local_90;
                local_58 = local_5c;
              }
              else {
                local_44 = local_44 + iVar5;
                local_88 = (undefined1 *)0x0;
              }
            }
          }
          else {
            iVar2 = local_48 - 0x1161;
            if ((iVar2 < 0) || (0x14 < iVar2)) {
              if (local_88 == (undefined1 *)0x0) {
                while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
                      local_50 == 0) {
                  local_10[1] = (long)local_38 - *local_10;
                  paVar4 = archive_string_ensure
                                     (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                  if (paVar4 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  local_38 = (undefined1 *)(*local_10 + local_10[1]);
                  local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                }
                local_38 = local_38 + local_50;
              }
              else {
                if (local_40 < local_38 + local_58) {
                  local_10[1] = (long)local_38 - *local_10;
                  paVar4 = archive_string_ensure
                                     (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
                  if (paVar4 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  local_38 = (undefined1 *)(*local_10 + local_10[1]);
                  local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
                }
                switch(local_58) {
                case 4:
                  *local_38 = *local_88;
                  local_88 = local_88 + 1;
                  local_38 = local_38 + 1;
                case 3:
                  *local_38 = *local_88;
                  local_88 = local_88 + 1;
                  local_38 = local_38 + 1;
                case 2:
                  *local_38 = *local_88;
                  local_88 = local_88 + 1;
                  local_38 = local_38 + 1;
                case 1:
                  *local_38 = *local_88;
                  local_38 = local_38 + 1;
                }
              }
              local_44 = local_48;
              local_88 = local_90;
              local_58 = local_5c;
            }
            else {
              local_44 = (iVar5 * 0x15 + iVar2) * 0x1c + 0xac00;
              local_88 = (undefined1 *)0x0;
            }
          }
        }
        else {
          if (local_88 == (undefined1 *)0x0) {
            while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
                  local_50 == 0) {
              local_10[1] = (long)local_38 - *local_10;
              paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
              if (paVar4 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              local_38 = (undefined1 *)(*local_10 + local_10[1]);
              local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
            }
            local_38 = local_38 + local_50;
          }
          else {
            if (local_40 < local_38 + local_58) {
              local_10[1] = (long)local_38 - *local_10;
              paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
              if (paVar4 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              local_38 = (undefined1 *)(*local_10 + local_10[1]);
              local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
            }
            switch(local_58) {
            case 4:
              *local_38 = *local_88;
              local_88 = local_88 + 1;
              local_38 = local_38 + 1;
            case 3:
              *local_38 = *local_88;
              local_88 = local_88 + 1;
              local_38 = local_38 + 1;
            case 2:
              *local_38 = *local_88;
              local_88 = local_88 + 1;
              local_38 = local_38 + 1;
            case 1:
              *local_38 = *local_88;
              local_38 = local_38 + 1;
            }
          }
          local_88 = local_90;
          local_58 = local_5c;
          local_44 = local_48;
        }
      }
      goto LAB_00282c4c;
    }
    while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44), local_50 == 0)
    {
      local_10[1] = (long)local_38 - *local_10;
      paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (paVar4 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      local_38 = (undefined1 *)(*local_10 + local_10[1]);
      local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
    }
    local_38 = local_38 + local_50;
    local_30 = local_30 + -local_58;
    local_20 = local_20 - -local_58;
    local_60 = L'\xffffffff';
  }
  goto switchD_0028320e_default;
LAB_002820f1:
  if ((9 < local_114) ||
     (local_f8 = (*local_78)(local_b8 + local_114,local_30,local_20), local_f8 < 1))
  goto LAB_00282269;
  if (local_b8[local_114] < 0x1d245) {
    local_14c = (uint)ccc_val[ccc_val_index[""[local_b8[local_114] >> 8]]
                              [local_b8[local_114] >> 4 & 0xf]][local_b8[local_114] & 0xf];
  }
  else {
    local_14c = 0;
  }
  local_f0 = local_14c;
  if (((local_14c <= local_ec) && (local_ec != 0xe4)) && (local_14c != 0xe4)) goto LAB_00282269;
  local_30 = local_30 + local_f8;
  local_20 = local_20 - local_f8;
  local_ec = local_14c;
  local_e8[local_114] = local_14c;
  local_114 = local_114 + 1;
  goto LAB_002820f1;
LAB_00282269:
  if (local_114 < 10) {
    local_fc = local_114;
  }
  else {
    local_60 = L'\xffffffff';
    local_fc = 10;
  }
  local_f4 = 1;
  while (local_f4 < local_fc) {
    uVar3 = get_nfc(local_44,local_b8[local_f4]);
    if (uVar3 == 0) {
      local_f4 = local_f4 + 1;
    }
    else {
      local_44 = uVar3;
      local_88 = (undefined1 *)0x0;
      for (local_118 = local_f4; local_118 + 1 < local_fc; local_118 = local_118 + 1) {
        local_b8[local_118] = local_b8[local_118 + 1];
        local_e8[local_118] = local_e8[local_118 + 1];
      }
      local_11c = local_fc + -1;
      iVar5 = local_11c;
      if (((0 < local_11c) && (iVar5 = local_11c, local_f4 == local_11c)) &&
         ((iVar5 = local_11c, 0 < local_f8 && (iVar5 = local_11c, local_f0 == local_ec)))) {
        local_ec = local_e8[local_fc + -2];
        while ((local_11c < 10 &&
               (local_f8 = (*local_78)(local_b8 + local_11c,local_30,local_20), 0 < local_f8))) {
          if (local_b8[local_11c] < 0x1d245) {
            local_150 = (uint)ccc_val[ccc_val_index[""[local_b8[local_11c] >> 8]]
                                      [local_b8[local_11c] >> 4 & 0xf]][local_b8[local_11c] & 0xf];
          }
          else {
            local_150 = 0;
          }
          local_f0 = local_150;
          if ((((int)local_150 <= (int)local_ec) && (local_ec != 0xe4)) && (local_150 != 0xe4))
          break;
          local_30 = local_30 + local_f8;
          local_20 = local_20 - local_f8;
          local_ec = local_150;
          local_e8[local_11c] = local_150;
          local_11c = local_11c + 1;
        }
        if (local_11c < 10) {
          local_fc = local_11c;
          iVar5 = local_fc;
        }
        else {
          local_60 = L'\xffffffff';
          local_fc = 10;
          iVar5 = local_fc;
        }
      }
      local_fc = iVar5;
      local_f4 = 0;
    }
  }
  if (local_88 == (undefined1 *)0x0) {
    while( true ) {
      local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44);
      if (local_50 != 0) break;
      local_10[1] = (long)local_38 - *local_10;
      paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (paVar4 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      local_38 = (undefined1 *)(*local_10 + local_10[1]);
      local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
    }
    local_38 = local_38 + local_50;
  }
  else {
    if (local_40 < local_38 + local_58) {
      local_10[1] = (long)local_38 - *local_10;
      paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (paVar4 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      local_38 = (undefined1 *)(*local_10 + local_10[1]);
      local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
    }
    switch(local_58) {
    case 4:
      *local_38 = *local_88;
      local_88 = local_88 + 1;
      local_38 = local_38 + 1;
    case 3:
      *local_38 = *local_88;
      local_88 = local_88 + 1;
      local_38 = local_38 + 1;
    case 2:
      *local_38 = *local_88;
      local_88 = local_88 + 1;
      local_38 = local_38 + 1;
    case 1:
      puVar1 = local_38;
      local_38 = local_38 + 1;
      *puVar1 = *local_88;
    default:
      local_88 = (undefined1 *)0x0;
    }
  }
  for (local_f4 = 0; local_f4 < local_fc; local_f4 = local_f4 + 1) {
    while( true ) {
      local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_b8[local_f4]);
      if (local_50 != 0) break;
      local_10[1] = (long)local_38 - *local_10;
      paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (paVar4 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      local_38 = (undefined1 *)(*local_10 + local_10[1]);
      local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
    }
    local_38 = local_38 + local_50;
  }
  if (((0 < local_f8) && (local_f0 == local_ec)) && (local_20 != 0)) {
    while (local_f8 = (*local_78)(local_b8,local_30,local_20), 0 < local_f8) {
      if (local_b8[0] < 0x1d245) {
        local_15c = (uint)ccc_val[ccc_val_index[""[local_b8[0] >> 8]][local_b8[0] >> 4 & 0xf]]
                          [local_b8[0] & 0xf];
      }
      else {
        local_15c = 0;
      }
      if ((int)local_15c < (int)local_ec) break;
      local_30 = local_30 + local_f8;
      local_20 = local_20 - local_f8;
      local_ec = local_15c;
      while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_b8[0]),
            local_50 == 0) {
        local_10[1] = (long)local_38 - *local_10;
        paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      local_38 = local_38 + local_50;
    }
  }
LAB_00282c4c:
  if (local_5c < 0) {
    if (local_88 == (undefined1 *)0x0) {
      while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
            local_50 == 0) {
        local_10[1] = (long)local_38 - *local_10;
        paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      local_38 = local_38 + local_50;
    }
    else {
      if (local_40 < local_38 + local_58) {
        local_10[1] = (long)local_38 - *local_10;
        paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      in_stack_fffffffffffffe98 = (archive_string *)(ulong)(local_58 - 1);
      switch(in_stack_fffffffffffffe98) {
      case (archive_string *)0x3:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case (archive_string *)0x2:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case (archive_string *)0x1:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case (archive_string *)0x0:
        *local_38 = *local_88;
        local_38 = local_38 + 1;
      default:
        local_88 = (undefined1 *)0x0;
      }
    }
    while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_48), local_50 == 0)
    {
      local_10[1] = (long)local_38 - *local_10;
      paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (paVar4 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      local_38 = (undefined1 *)(*local_10 + local_10[1]);
      local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
    }
    local_38 = local_38 + local_50;
    local_30 = local_30 + -local_5c;
    local_20 = local_20 - -local_5c;
    local_60 = L'\xffffffff';
  }
  else if (local_5c == 0) {
    if (local_88 == (undefined1 *)0x0) {
      while (local_50 = (*local_80)(local_38,(long)local_40 - (long)local_38,local_44),
            local_50 == 0) {
        local_10[1] = (long)local_38 - *local_10;
        paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
        local_40 = (undefined1 *)((*local_10 + local_10[2]) - (long)local_68);
      }
      local_38 = local_38 + local_50;
    }
    else {
      if (local_40 < local_38 + local_58) {
        local_10[1] = (long)local_38 - *local_10;
        paVar4 = archive_string_ensure(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_38 = (undefined1 *)(*local_10 + local_10[1]);
      }
      switch(local_58) {
      case 4:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case 3:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case 2:
        *local_38 = *local_88;
        local_88 = local_88 + 1;
        local_38 = local_38 + 1;
      case 1:
        *local_38 = *local_88;
        local_38 = local_38 + 1;
      }
    }
switchD_0028320e_default:
    local_10[1] = (long)local_38 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    if (local_68 == 2) {
      *(undefined1 *)(*local_10 + 1 + local_10[1]) = 0;
    }
    return local_60;
  }
  goto LAB_00280eee;
}

Assistant:

static int
archive_string_normalize_C(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr, *uc2ptr;

		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Read second code point. */
		while ((n2 = parse(&uc2, s, len)) > 0) {
			uint32_t ucx[FDC_MAX];
			int ccx[FDC_MAX];
			int cl, cx, i, nx, ucx_size;
			int LIndex,SIndex;
			uint32_t nfc;

			if (n2 == spair || always_replace)
				/* uc2 is converted from a surrogate pair.
			 	 * this should be treated as a changed code. */
				uc2ptr = NULL;
			else
				uc2ptr = s;
			s += n2;
			len -= n2;

			/*
			 * If current second code point is out of decomposable
			 * code points, finding compositions is unneeded.
			 */
			if (!IS_DECOMPOSABLE_BLOCK(uc2)) {
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Try to combine current code points.
			 */
			/*
			 * We have to combine Hangul characters according to
			 * http://uniicode.org/reports/tr15/#Hangul
			 */
			if (0 <= (LIndex = uc - HC_LBASE) &&
			    LIndex < HC_LCOUNT) {
				/*
				 * Hangul Composition.
				 * 1. Two current code points are L and V.
				 */
				int VIndex = uc2 - HC_VBASE;
				if (0 <= VIndex && VIndex < HC_VCOUNT) {
					/* Make syllable of form LV. */
					UPDATE_UC(HC_SBASE +
					    (LIndex * HC_VCOUNT + VIndex) *
					     HC_TCOUNT);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if (0 <= (SIndex = uc - HC_SBASE) &&
			    SIndex < HC_SCOUNT && (SIndex % HC_TCOUNT) == 0) {
				/*
				 * Hangul Composition.
				 * 2. Two current code points are LV and T.
				 */
				int TIndex = uc2 - HC_TBASE;
				if (0 < TIndex && TIndex < HC_TCOUNT) {
					/* Make syllable of form LVT. */
					UPDATE_UC(uc + TIndex);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if ((nfc = get_nfc(uc, uc2)) != 0) {
				/* A composition to current code points
				 * is found. */
				UPDATE_UC(nfc);
				continue;
			} else if ((cl = CCC(uc2)) == 0) {
				/* Clearly 'uc2' the second code point is not
				 * a decomposable code. */
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Collect following decomposable code points.
			 */
			cx = 0;
			ucx[0] = uc2;
			ccx[0] = cl;
			COLLECT_CPS(1);

			/*
			 * Find a composed code in the collected code points.
			 */
			i = 1;
			while (i < ucx_size) {
				int j;

				if ((nfc = get_nfc(uc, ucx[i])) == 0) {
					i++;
					continue;
				}

				/*
				 * nfc is composed of uc and ucx[i].
				 */
				UPDATE_UC(nfc);

				/*
				 * Remove ucx[i] by shifting
				 * following code points.
				 */
				for (j = i; j+1 < ucx_size; j++) {
					ucx[j] = ucx[j+1];
					ccx[j] = ccx[j+1];
				}
				ucx_size --;

				/*
				 * Collect following code points blocked
				 * by ucx[i] the removed code point.
				 */
				if (ucx_size > 0 && i == ucx_size &&
				    nx > 0 && cx == cl) {
					cl =  ccx[ucx_size-1];
					COLLECT_CPS(ucx_size);
				}
				/*
				 * Restart finding a composed code with
				 * the updated uc from the top of the
				 * collected code points.
				 */
				i = 0;
			}

			/*
			 * Apparently the current code points are not
			 * decomposed characters or already composed.
			 */
			WRITE_UC();
			for (i = 0; i < ucx_size; i++)
				UNPARSE(p, endp, ucx[i]);

			/*
			 * Flush out remaining canonical combining characters.
			 */
			if (nx > 0 && cx == cl && len > 0) {
				while ((nx = parse(&ucx[0], s, len))
				    > 0) {
					cx = CCC(ucx[0]);
					if (cl > cx)
						break;
					s += nx;
					len -= nx;
					cl = cx;
					UNPARSE(p, endp, ucx[0]);
				}
			}
			break;
		}
		if (n2 < 0) {
			WRITE_UC();
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc2);
			s += n2*-1;
			len -= n2*-1;
			ret = -1;
			continue;
		} else if (n2 == 0) {
			WRITE_UC();
			break;
		}
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}